

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# falcon.c
# Opt level: O1

void falcon_prep(disisa *isa)

{
  int iVar1;
  int f;
  int f_00;
  int iVar2;
  int f_01;
  int f_02;
  int f_03;
  int v;
  int v_00;
  int v_01;
  int v_02;
  vardata *data;
  
  data = vardata_new("falcon");
  isa->vardata = data;
  iVar1 = vardata_add_feature(data,"fuc0op","v0 exclusive opcodes");
  f = vardata_add_feature(isa->vardata,"fuc3op","v3+ opcodes");
  f_00 = vardata_add_feature(isa->vardata,"fuc4op","v4+ opcodes");
  iVar2 = vardata_add_feature(isa->vardata,"crypt","Cryptographic coprocessor");
  f_01 = vardata_add_feature(isa->vardata,"fuc5op","v5+ opcodes");
  f_02 = vardata_add_feature(isa->vardata,"fucold","v0-v4 opcodes");
  f_03 = vardata_add_feature(isa->vardata,"fuc6op","v6+ opcodes");
  if (((((iVar1 != -1) && (f != -1)) && (f_00 != -1)) && ((iVar2 != -1 && (f_01 != -1)))) &&
     ((f_02 != -1 && (f_03 != -1)))) {
    iVar2 = vardata_add_varset(isa->vardata,"version","falcon version");
    if (iVar2 != -1) {
      v = vardata_add_variant(isa->vardata,"fuc0","falcon v0",iVar2);
      v_00 = vardata_add_variant(isa->vardata,"fuc3","falcon v3",iVar2);
      v_01 = vardata_add_variant(isa->vardata,"fuc4","falcon v4",iVar2);
      v_02 = vardata_add_variant(isa->vardata,"fuc5","falcon v5",iVar2);
      iVar2 = vardata_add_variant(isa->vardata,"fuc6","falcon v6",iVar2);
      if (((v != -1) && (v_00 != -1)) && ((v_01 != -1 && ((v_02 != -1 && (iVar2 != -1)))))) {
        vardata_variant_feature(isa->vardata,v,iVar1);
        vardata_variant_feature(isa->vardata,v,f_02);
        vardata_variant_feature(isa->vardata,v_00,f);
        vardata_variant_feature(isa->vardata,v_00,f_02);
        vardata_variant_feature(isa->vardata,v_01,f);
        vardata_variant_feature(isa->vardata,v_01,f_02);
        vardata_variant_feature(isa->vardata,v_01,f_00);
        vardata_variant_feature(isa->vardata,v_02,f);
        vardata_variant_feature(isa->vardata,v_02,f_00);
        vardata_variant_feature(isa->vardata,v_02,f_01);
        vardata_variant_feature(isa->vardata,iVar2,f);
        vardata_variant_feature(isa->vardata,iVar2,f_00);
        vardata_variant_feature(isa->vardata,iVar2,f_01);
        vardata_variant_feature(isa->vardata,iVar2,f_03);
        iVar1 = vardata_validate(isa->vardata);
        if (iVar1 == 0) {
          return;
        }
      }
    }
  }
  abort();
}

Assistant:

static void falcon_prep(struct disisa *isa) {
	isa->vardata = vardata_new("falcon");
	int f_fuc0op = vardata_add_feature(isa->vardata, "fuc0op", "v0 exclusive opcodes");
	/* XXX rename variants */
	int f_fuc3op = vardata_add_feature(isa->vardata, "fuc3op", "v3+ opcodes");
	int f_fuc4op = vardata_add_feature(isa->vardata, "fuc4op", "v4+ opcodes");
	int f_crypt = vardata_add_feature(isa->vardata, "crypt", "Cryptographic coprocessor");
	int f_fuc5op = vardata_add_feature(isa->vardata, "fuc5op", "v5+ opcodes");
	int f_fucold = vardata_add_feature(isa->vardata, "fucold", "v0-v4 opcodes");
	int f_fuc6op = vardata_add_feature(isa->vardata, "fuc6op", "v6+ opcodes");
	if (f_fuc0op == -1 || f_fuc3op == -1 || f_fuc4op == -1 || f_crypt == -1 || f_fuc5op == -1 || f_fucold == -1 || f_fuc6op == -1 )
		abort();
	int vs_fucver = vardata_add_varset(isa->vardata, "version", "falcon version");
	if (vs_fucver == -1)
		abort();
	int v_fuc0 = vardata_add_variant(isa->vardata, "fuc0", "falcon v0", vs_fucver);
	int v_fuc3 = vardata_add_variant(isa->vardata, "fuc3", "falcon v3", vs_fucver);
	int v_fuc4 = vardata_add_variant(isa->vardata, "fuc4", "falcon v4", vs_fucver);
	int v_fuc5 = vardata_add_variant(isa->vardata, "fuc5", "falcon v5", vs_fucver);
	int v_fuc6 = vardata_add_variant(isa->vardata, "fuc6", "falcon v6", vs_fucver);
	if (v_fuc0 == -1 || v_fuc3 == -1 || v_fuc4 == -1 || v_fuc5 == -1 || v_fuc6 == -1)
		abort();
	vardata_variant_feature(isa->vardata, v_fuc0, f_fuc0op);
	vardata_variant_feature(isa->vardata, v_fuc0, f_fucold);
	vardata_variant_feature(isa->vardata, v_fuc3, f_fuc3op);
	vardata_variant_feature(isa->vardata, v_fuc3, f_fucold);
	vardata_variant_feature(isa->vardata, v_fuc4, f_fuc3op);
	vardata_variant_feature(isa->vardata, v_fuc4, f_fucold);
	vardata_variant_feature(isa->vardata, v_fuc4, f_fuc4op);
	vardata_variant_feature(isa->vardata, v_fuc5, f_fuc3op);
	vardata_variant_feature(isa->vardata, v_fuc5, f_fuc4op);
	vardata_variant_feature(isa->vardata, v_fuc5, f_fuc5op);
	vardata_variant_feature(isa->vardata, v_fuc6, f_fuc3op);
	vardata_variant_feature(isa->vardata, v_fuc6, f_fuc4op);
	vardata_variant_feature(isa->vardata, v_fuc6, f_fuc5op);
	vardata_variant_feature(isa->vardata, v_fuc6, f_fuc6op);
	if (vardata_validate(isa->vardata))
		abort();
}